

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizing.cpp
# Opt level: O0

Vec3f getBarycentricCoordinates(Vec3f *AB,Vec3f *AC,Vec3f *PA)

{
  float *in_RCX;
  undefined8 extraout_XMM0_Qa;
  float _y;
  Vec3f VVar1;
  Vec3<float> local_70;
  Vec3<float> local_64;
  Vec3<float> local_58;
  undefined1 local_4c [8];
  Vec3f coor;
  Vec3f vecY;
  Vec3f vecX;
  Vec3f *PA_local;
  Vec3f *AC_local;
  Vec3f *AB_local;
  
  Vec3<float>::Vec3((Vec3<float> *)&vecY.y);
  Vec3<float>::Vec3((Vec3<float> *)&coor.y);
  Vec3<float>::Vec3((Vec3<float> *)local_4c);
  Vec3<float>::Vec3(&local_58,AC->x,PA->x,*in_RCX);
  Vec3<float>::operator=((Vec3<float> *)&vecY.y,&local_58);
  Vec3<float>::Vec3(&local_64,AC->y,PA->y,in_RCX[1]);
  Vec3<float>::operator=((Vec3<float> *)&coor.y,&local_64);
  Vec3<float>::operator^(&local_70,(Vec3<float> *)&vecY.y);
  Vec3<float>::operator=((Vec3<float> *)local_4c,&local_70);
  _y = (float)local_4c._0_4_ / coor.x;
  Vec3<float>::Vec3(AB,1.0 - ((float)local_4c._0_4_ + (float)local_4c._4_4_) / coor.x,_y,
                    (float)local_4c._4_4_ / coor.x);
  VVar1.z = _y;
  VVar1.x = (float)(int)extraout_XMM0_Qa;
  VVar1.y = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return VVar1;
}

Assistant:

Vec3f getBarycentricCoordinates(const Vec3f &AB, const Vec3f &AC, const Vec3f &PA){
    Vec3f vecX, vecY, coor;
    vecX = Vec3f(AB.x, AC.x, PA.x);
    vecY = Vec3f(AB.y, AC.y, PA.y);
    coor = vecX^vecY;
    return Vec3f((1.f - (coor.x + coor.y)/coor.z), (coor.x / coor.z), (coor.y / coor.z));
}